

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode do_init_writer_stack(Curl_easy *data)

{
  CURLcode local_24;
  Curl_cwriter *pCStack_20;
  CURLcode result;
  Curl_cwriter *writer;
  Curl_easy *data_local;
  
  writer = (Curl_cwriter *)data;
  data_local._4_4_ =
       Curl_cwriter_create(&(data->req).writer_stack,data,&Curl_cwt_out,CURL_CW_CLIENT);
  if (data_local._4_4_ == CURLE_OK) {
    local_24 = Curl_cwriter_create(&stack0xffffffffffffffe0,(Curl_easy *)writer,&Curl_cwt_pause,
                                   CURL_CW_PROTOCOL);
    if ((local_24 == CURLE_OK) &&
       (local_24 = Curl_cwriter_add((Curl_easy *)writer,pCStack_20), local_24 != CURLE_OK)) {
      Curl_cwriter_free((Curl_easy *)writer,pCStack_20);
    }
    if (local_24 == CURLE_OK) {
      local_24 = Curl_cwriter_create(&stack0xffffffffffffffe0,(Curl_easy *)writer,&cw_download,
                                     CURL_CW_PROTOCOL);
      if ((local_24 == CURLE_OK) &&
         (local_24 = Curl_cwriter_add((Curl_easy *)writer,pCStack_20), local_24 != CURLE_OK)) {
        Curl_cwriter_free((Curl_easy *)writer,pCStack_20);
      }
      if (local_24 == CURLE_OK) {
        local_24 = Curl_cwriter_create(&stack0xffffffffffffffe0,(Curl_easy *)writer,&cw_raw,
                                       CURL_CW_RAW);
        if ((local_24 == CURLE_OK) &&
           (local_24 = Curl_cwriter_add((Curl_easy *)writer,pCStack_20), local_24 != CURLE_OK)) {
          Curl_cwriter_free((Curl_easy *)writer,pCStack_20);
        }
        if (local_24 == CURLE_OK) {
          data_local._4_4_ = local_24;
        }
        else {
          data_local._4_4_ = local_24;
        }
      }
      else {
        data_local._4_4_ = local_24;
      }
    }
    else {
      data_local._4_4_ = local_24;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode do_init_writer_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &Curl_cwt_out, CURL_CW_CLIENT);
  if(result)
    return result;

  /* This places the "pause" writer behind the "download" writer that
   * is added below. Meaning the "download" can do checks on content length
   * and other things *before* write outs are buffered for paused transfers. */
  result = Curl_cwriter_create(&writer, data, &Curl_cwt_pause,
                               CURL_CW_PROTOCOL);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  return result;
}